

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

InlineeFrameRecord * __thiscall
Js::EntryPointInfo::FindInlineeFrame(EntryPointInfo *this,void *returnAddress)

{
  InProcNativeEntryPointData *this_00;
  InlineeFrameMap *this_01;
  DWORD_PTR DVar1;
  NativeOffsetInlineeFramePair *pNVar2;
  Type *pTVar3;
  int index;
  int iVar4;
  int index_00;
  
  this_00 = (InProcNativeEntryPointData *)GetNativeEntryPointData(this);
  this_01 = InProcNativeEntryPointData::GetInlineeFrameMap(this_00);
  if (this_01 != (InlineeFrameMap *)0x0) {
    DVar1 = GetNativeAddress(this);
    index_00 = (this_01->
               super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>
               ).count + -1;
    if (-1 < index_00) {
      iVar4 = 0;
      do {
        index = (index_00 - iVar4) / 2 + iVar4;
        pNVar2 = JsUtil::
                 ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>
                 ::Item(&this_01->
                         super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>
                        ,index);
        if ((ulong)pNVar2->offset < (long)returnAddress - DVar1) {
          iVar4 = index + 1;
        }
        else if ((index == 0) ||
                ((index_00 = index + -1, 0 < index &&
                 (pTVar3 = JsUtil::
                           List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                           ::Item(this_01,index_00),
                 (ulong)pTVar3->offset < (long)returnAddress - DVar1)))) {
          pTVar3 = JsUtil::
                   List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Item(this_01,index);
          return pTVar3->record;
        }
      } while (iVar4 <= index_00);
    }
  }
  return (InlineeFrameRecord *)0x0;
}

Assistant:

InlineeFrameRecord* EntryPointInfo::FindInlineeFrame(void* returnAddress)
    {
#if ENABLE_OOP_NATIVE_CODEGEN
        if (JITManager::GetJITManager()->IsOOPJITEnabled())  // OOP JIT
        {
            OOPNativeEntryPointData * oopNativeEntryPointData = this->GetOOPNativeEntryPointData();
            char * nativeDataBuffer = oopNativeEntryPointData->GetNativeDataBuffer();
            NativeOffsetInlineeFrameRecordOffset* offsets = (NativeOffsetInlineeFrameRecordOffset*)(nativeDataBuffer + oopNativeEntryPointData->GetInlineeFrameOffsetArrayOffset());
            size_t offset = (size_t)((BYTE*)returnAddress - (BYTE*)this->GetNativeAddress());

            uint inlineeFrameOffsetArrayCount = oopNativeEntryPointData->GetInlineeFrameOffsetArrayCount();
            if (inlineeFrameOffsetArrayCount == 0)
            {
                return nullptr;
            }

            uint fromIndex = 0;
            uint toIndex = inlineeFrameOffsetArrayCount - 1;
            while (fromIndex <= toIndex)
            {
                uint midIndex = fromIndex + (toIndex - fromIndex) / 2;
                auto item = offsets[midIndex];

                if (item.offset >= offset)
                {
                    if (midIndex == 0 || (midIndex > 0 && offsets[midIndex - 1].offset < offset))
                    {
                        if (offsets[midIndex].recordOffset == NativeOffsetInlineeFrameRecordOffset::InvalidRecordOffset)
                        {
                            return nullptr;
                        }
                        else
                        {
                            return (InlineeFrameRecord*)(nativeDataBuffer + offsets[midIndex].recordOffset);
                        }
                    }
                    else
                    {
                        toIndex = midIndex - 1;
                    }
                }
                else
                {
                    fromIndex = midIndex + 1;
                }
            }
            return nullptr;
        }
        else
#endif
        // in-proc JIT
        {
            InlineeFrameMap * inlineeFrameMap = this->GetInProcNativeEntryPointData()->GetInlineeFrameMap();
            if (inlineeFrameMap == nullptr)
            {
                return nullptr;
            }

            size_t offset = (size_t)((BYTE*)returnAddress - (BYTE*)this->GetNativeAddress());
            int index = inlineeFrameMap->BinarySearch([=](const NativeOffsetInlineeFramePair& pair, int index) {
                if (pair.offset >= offset)
                {
                    if (index == 0 || (index > 0 && inlineeFrameMap->Item(index - 1).offset < offset))
                    {
                        return 0;
                    }
                    else
                    {
                        return 1;
                    }
                }
                return -1;
            });

            if (index == -1)
            {
                return nullptr;
            }
            return inlineeFrameMap->Item(index).record;
        }

    }